

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cpp
# Opt level: O1

void __thiscall
daw::cw_details::curl_headers::add_header(curl_headers *this,string_view name,string_view value)

{
  pointer __p;
  runtime_error *this_00;
  string header;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  std::__cxx11::string::reserve((ulong)&local_50);
  std::__cxx11::string::append((char *)&local_50,(ulong)name._M_str);
  std::__cxx11::string::push_back((char)&local_50);
  std::__cxx11::string::append((char *)&local_50,(ulong)value._M_str);
  __p = (pointer)curl_slist_append((this->m_values)._M_t.
                                   super___uniq_ptr_impl<curl_slist,_daw::cw_details::(anonymous_namespace)::curl_slist_deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_curl_slist_*,_daw::cw_details::(anonymous_namespace)::curl_slist_deleter>
                                   .super__Head_base<0UL,_curl_slist_*,_false>._M_head_impl,local_50
                                  );
  if ((this->m_values)._M_t.
      super___uniq_ptr_impl<curl_slist,_daw::cw_details::(anonymous_namespace)::curl_slist_deleter>.
      _M_t.
      super__Tuple_impl<0UL,_curl_slist_*,_daw::cw_details::(anonymous_namespace)::curl_slist_deleter>
      .super__Head_base<0UL,_curl_slist_*,_false>._M_head_impl == (curl_slist *)0x0) {
    if (__p == (pointer)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"curl_slist_append should always set list to non_null");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::unique_ptr<curl_slist,_daw::cw_details::(anonymous_namespace)::curl_slist_deleter>::reset
              (&this->m_values,__p);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void add_header( std::string_view name, std::string_view value ) {
			auto header = std::string( );
			header.reserve( std::size( name ) + std::size( value ) + 1 );
			header.append( std::data( name ), std::size( name ) );
			header += ':';
			header.append( value.data( ), value.size( ) );

			if( auto p = curl_slist_append( m_values.get( ), header.data( ) );
			    not m_values ) {

				if( not p ) {
					throw std::runtime_error(
					  "curl_slist_append should always set list to non_null" );
				}
				m_values.reset( p );
			}
		}